

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O3

void audit_regressor_feature(audit_regressor_data *dat,float param_2,uint64_t ft_idx)

{
  sparse_parameters *psVar1;
  vw *pvVar2;
  _func_void_weight_ptr_void_ptr *p_Var3;
  ulong __val;
  bool bVar4;
  char cVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var6;
  ostream *poVar7;
  float *pfVar8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong uVar12;
  weight *pwVar13;
  char cVar14;
  pointer pbVar15;
  string temp;
  uint64_t index_1;
  uint64_t index_2;
  string ns_pre;
  string __str;
  ostringstream tempstream;
  long *local_248;
  float *local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  float *local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  _func_int **local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  char *local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  char local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pvVar2 = dat->all;
  if ((pvVar2->weights).sparse == true) {
    psVar1 = &(pvVar2->weights).sparse_weights;
    local_1e8 = (_func_int **)((pvVar2->weights).sparse_weights._weight_mask & ft_idx);
    _Var6._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)psVar1,(key_type *)&local_1e8);
    if (_Var6._M_cur == (__node_type *)0x0) {
      local_1a8._8_8_ =
           calloc_or_throw<float>
                     (1L << ((byte)(pvVar2->weights).sparse_weights._stride_shift & 0x3f));
      local_1a8._0_8_ = local_1e8;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_long,float*>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)psVar1);
      _Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)psVar1,(key_type *)&local_1e8);
      p_Var3 = (pvVar2->weights).sparse_weights.fun;
      if (p_Var3 != (_func_void_weight_ptr_void_ptr *)0x0) {
        (*p_Var3)(*(weight **)((long)_Var6._M_cur + 0x10),
                  (pvVar2->weights).sparse_weights.default_data);
      }
    }
    pfVar8 = *(float **)
              ((long)&((_Var6._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                      super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                      _M_storage._M_storage + 8);
  }
  else {
    pfVar8 = (pvVar2->weights).dense_weights._begin +
             ((pvVar2->weights).dense_weights._weight_mask & ft_idx);
  }
  if ((*pfVar8 != 0.0) || (NAN(*pfVar8))) {
    dat->values_audited = dat->values_audited + 1;
    local_1e8 = (_func_int **)local_1d8;
    local_1e0 = 0;
    local_1d8[0] = 0;
    pbVar15 = (dat->ns_pre->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar15 !=
        (dat->ns_pre->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)(pbVar15->_M_dataplus)._M_p);
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 !=
               (dat->ns_pre->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_248._0_1_ = (string)0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_248,1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    local_248 = (long *)CONCAT71(local_248._1_7_,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_248,1);
    if ((pvVar2->weights).sparse == true) {
      psVar1 = &(pvVar2->weights).sparse_weights;
      local_228 = (long *)((pvVar2->weights).sparse_weights._weight_mask & ft_idx);
      _Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)psVar1,(key_type *)&local_228);
      if (_Var6._M_cur == (__node_type *)0x0) {
        local_240 = calloc_or_throw<float>
                              (1L << ((byte)(pvVar2->weights).sparse_weights._stride_shift & 0x3f));
        local_248 = local_228;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)psVar1);
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,(key_type *)&local_228);
        p_Var3 = (pvVar2->weights).sparse_weights.fun;
        if (p_Var3 != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*p_Var3)(*(weight **)((long)_Var6._M_cur + 0x10),
                    (pvVar2->weights).sparse_weights.default_data);
        }
      }
      pfVar8 = *(float **)
                ((long)&((_Var6._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                        super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                        _M_storage._M_storage + 8);
    }
    else {
      pfVar8 = (pvVar2->weights).dense_weights._begin +
               ((pvVar2->weights).dense_weights._weight_mask & ft_idx);
    }
    std::ostream::_M_insert<double>((double)*pfVar8);
    std::__cxx11::stringbuf::str();
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_1e8)
    ;
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_218 = *plVar11;
      lStack_210 = plVar9[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar11;
      local_228 = (long *)*plVar9;
    }
    local_220 = (float *)plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_228,(ulong)local_220,0,'\x01');
    local_248 = &local_238;
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_238 = *plVar11;
      lStack_230 = plVar9[3];
    }
    else {
      local_238 = *plVar11;
      local_248 = (long *)*plVar9;
    }
    local_240 = (float *)plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if (local_228 != &local_218) {
      operator_delete(local_228);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208);
    }
    if (1 < dat->total_class_cnt) {
      __val = dat->cur_class;
      cVar14 = '\x01';
      if (9 < __val) {
        uVar12 = __val;
        cVar5 = '\x04';
        do {
          cVar14 = cVar5;
          if (uVar12 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_0021d1e8;
          }
          if (uVar12 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_0021d1e8;
          }
          if (uVar12 < 10000) goto LAB_0021d1e8;
          bVar4 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar5 = cVar14 + '\x04';
        } while (bVar4);
        cVar14 = cVar14 + '\x01';
      }
LAB_0021d1e8:
      local_1c8 = local_1b8;
      std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_1c8,local_1c0,__val);
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_replace_aux
                          ((ulong)&local_1c8,CONCAT44(uStack_1bc,local_1c0),0,'\x01');
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_1f8 = *plVar9;
        uStack_1f0 = puVar10[3];
        local_208 = &local_1f8;
      }
      else {
        local_1f8 = *plVar9;
        local_208 = (long *)*puVar10;
      }
      local_200 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_248);
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_218 = *plVar9;
        lStack_210 = puVar10[3];
        local_228 = &local_218;
      }
      else {
        local_218 = *plVar9;
        local_228 = (long *)*puVar10;
      }
      local_220 = (float *)puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_248,(string *)&local_228);
      if (local_228 != &local_218) {
        operator_delete(local_228);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
    }
    io_buf::bin_write_fixed(dat->out_file,(char *)local_248,(ulong)local_240 & 0xffffffff);
    if ((pvVar2->weights).sparse == true) {
      psVar1 = &(pvVar2->weights).sparse_weights;
      local_208 = (long *)(ft_idx & (pvVar2->weights).sparse_weights._weight_mask);
      _Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)psVar1,(key_type *)&local_208);
      if (_Var6._M_cur == (__node_type *)0x0) {
        local_220 = calloc_or_throw<float>
                              (1L << ((byte)(pvVar2->weights).sparse_weights._stride_shift & 0x3f));
        local_228 = local_208;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)psVar1);
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)psVar1,(key_type *)&local_208);
        p_Var3 = (pvVar2->weights).sparse_weights.fun;
        if (p_Var3 != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*p_Var3)(*(weight **)((long)_Var6._M_cur + 0x10),
                    (pvVar2->weights).sparse_weights.default_data);
        }
      }
      pwVar13 = *(weight **)
                 ((long)&((_Var6._M_cur)->
                         super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                         super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                         _M_storage._M_storage + 8);
    }
    else {
      pwVar13 = (pvVar2->weights).dense_weights._begin +
                (ft_idx & (pvVar2->weights).dense_weights._weight_mask);
    }
    *pwVar13 = 0.0;
    if (local_248 != &local_238) {
      operator_delete(local_248);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_1e8 != (_func_int **)local_1d8) {
      operator_delete(local_1e8);
    }
  }
  return;
}

Assistant:

inline void audit_regressor_feature(audit_regressor_data& dat, const float, const uint64_t ft_idx)
{
  parameters& weights = dat.all->weights;
  if (weights[ft_idx] != 0)
    ++dat.values_audited;
  else
    return;

  string ns_pre;
  for (vector<string>::const_iterator s = dat.ns_pre->begin(); s != dat.ns_pre->end(); ++s) ns_pre += *s;

  ostringstream tempstream;
  tempstream << ':' << ((ft_idx & weights.mask()) >> weights.stride_shift()) << ':' << weights[ft_idx];

  string temp = ns_pre + tempstream.str() + '\n';
  if (dat.total_class_cnt > 1)  // add class prefix for multiclass problems
    temp = to_string(dat.cur_class) + ':' + temp;

  dat.out_file->bin_write_fixed(temp.c_str(), (uint32_t)temp.size());

  weights[ft_idx] = 0.;  // mark value audited
}